

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *name;
  int iVar1;
  uint uVar2;
  long lVar3;
  test *ptVar4;
  ulong uVar5;
  int test_count;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  int n;
  char **local_4040;
  test *tests_to_run [1024];
  test *tests [1024];
  long lVar8;
  
  local_4040 = argv;
  memset(tests_to_run,0,0x2000);
  if (argc < 2) {
    test_count = 0;
    if (0 < (long)::test_count) {
      lVar3 = (long)::test_count + -1;
      auVar6._8_4_ = (int)lVar3;
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
      ptVar4 = ::tests;
      lVar3 = 0;
      auVar6 = auVar6 ^ _DAT_0010d020;
      auVar7 = _DAT_0010d010;
      do {
        auVar9 = auVar7 ^ _DAT_0010d020;
        if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                    auVar6._4_4_ < auVar9._4_4_) & 1)) {
          *(test **)((long)tests_to_run + lVar3) = ptVar4;
        }
        if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
            auVar9._12_4_ <= auVar6._12_4_) {
          *(test **)((long)tests_to_run + lVar3 + 8) = ptVar4 + 1;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar3 = lVar3 + 0x10;
        ptVar4 = ptVar4 + 2;
        test_count = ::test_count;
      } while ((ulong)(::test_count + 1U >> 1) << 4 != lVar3);
    }
  }
  else {
    uVar5 = 1;
    test_count = 0;
    do {
      memset(tests,0,0x2000);
      n = 0x400;
      name = local_4040[uVar5];
      search_tests(name,tests,&n);
      iVar1 = n;
      if ((ulong)(uint)n == 0) {
        fprintf(_stderr,"WARN: No tests matching \"%s\" found.\n",name);
      }
      else if (0 < n) {
        memcpy(tests_to_run + test_count,tests,(ulong)(uint)n << 3);
        test_count = test_count + iVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  uVar2 = run_tests(tests_to_run,test_count);
  return uVar2 ^ 1;
}

Assistant:

int main(int argc, char *argv[]){
  struct test *tests_to_run[MAX_TESTS] = {0};
  int tests_to_runc = 0;
  if(1 < argc){
    for(int i=1; i<argc; ++i){
      struct test *tests[MAX_TESTS] = {0};
      int n = MAX_TESTS;
      search_tests(argv[i], tests, &n);
      if(n==0) fprintf(stderr, "WARN: No tests matching \"%s\" found.\n", argv[i]);
      else for(int j=0; j<n; ++j)
             tests_to_run[tests_to_runc++] = tests[j];
    }
  }else{
    for(int i=0; i<test_count; ++i){
      tests_to_run[tests_to_runc++] = &tests[i];
    }
  }

  return !run_tests(tests_to_run, tests_to_runc);
}